

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O2

void __thiscall Lodtalk::AST::PragmaDefinition::~PragmaDefinition(PragmaDefinition *this)

{
  pointer ppNVar1;
  pointer ppNVar2;
  
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__PragmaDefinition_001702c8;
  ppNVar1 = (this->parameters).
            super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppNVar2 = (this->parameters).
                 super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppNVar2 != ppNVar1; ppNVar2 = ppNVar2 + 1
      ) {
    if (*ppNVar2 != (Node *)0x0) {
      (*(*ppNVar2)->_vptr_Node[1])();
    }
  }
  std::_Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::~_Vector_base
            (&(this->parameters).
              super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>);
  std::__cxx11::string::~string((string *)&this->selector);
  return;
}

Assistant:

PragmaDefinition::~PragmaDefinition()
{
    for(auto param : parameters)
        delete param;
}